

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3CreateView(Parse *pParse,Token *pBegin,Token *pName1,Token *pName2,ExprList *pCNames,
                      Select *pSelect,int isTemp,int noErr)

{
  long lVar1;
  int iVar2;
  int iVar3;
  Select *pSVar4;
  ExprList *pEVar5;
  ExprList *in_RCX;
  sqlite3 *in_RDX;
  long *in_RSI;
  Parse *in_RDI;
  undefined8 in_R8;
  sqlite3 *in_R9;
  long in_FS_OFFSET;
  sqlite3 *db;
  int iDb;
  char *z;
  int n;
  Table *p;
  Token *pName;
  DbFixer sFix;
  Token sEnd;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  sqlite3 *in_stack_ffffffffffffff20;
  sqlite3 *db_00;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 uVar6;
  Parse *pParse_00;
  int flags;
  Select *pDup;
  Token *pName_00;
  Parse *in_stack_ffffffffffffff88;
  Parse *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffffb0;
  char *local_18;
  
  iVar3 = (int)((ulong)in_R8 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  flags = -0x55555556;
  pParse_00 = (Parse *)&DAT_aaaaaaaaaaaaaaaa;
  memset(&stack0xffffffffffffff88,0xaa,0x60);
  pName_00 = (Token *)0x0;
  uVar6 = 0xaaaaaaaa;
  db_00 = in_RDI->db;
  if (in_RDI->nVar < 1) {
    sqlite3StartTable(in_stack_ffffffffffffff90,(Token *)in_stack_ffffffffffffff88,(Token *)0x0,
                      (int)((ulong)in_RDI >> 0x20),(int)in_RDI,(int)((ulong)in_RSI >> 0x20),
                      in_stack_ffffffffffffffb0);
    pDup = (Select *)in_RDI->pNewTable;
    in_stack_ffffffffffffff18 = db._0_4_;
    if ((pDup != (Select *)0x0) && (in_RDI->nErr == 0)) {
      *(uint *)&pDup->pWhere = *(uint *)&pDup->pWhere | 0x200;
      sqlite3TwoPartName(pParse_00,(Token *)CONCAT44(uVar6,in_stack_ffffffffffffff30),(Token *)db_00
                         ,(Token **)in_stack_ffffffffffffff20);
      iVar2 = sqlite3SchemaToIndex(db_00,(Schema *)pDup->pLimit);
      sqlite3FixInit((DbFixer *)&stack0xffffffffffffff88,in_RDI,iVar2,"view",pName_00);
      iVar2 = sqlite3FixSelect((DbFixer *)in_stack_ffffffffffffff20,
                               (Select *)CONCAT44(in_stack_ffffffffffffff1c,db._0_4_));
      in_stack_ffffffffffffff18 = db._0_4_;
      if (iVar2 == 0) {
        *(uint *)((long)&in_R9->pVfs + 4) = *(uint *)((long)&in_R9->pVfs + 4) | 0x200000;
        if (in_RDI->eParseMode < 2) {
          pSVar4 = sqlite3SelectDup(in_R9,pDup,flags);
          pDup->pHaving = (Expr *)pSVar4;
          in_stack_ffffffffffffff18 = db._0_4_;
        }
        else {
          pDup->pHaving = (Expr *)in_R9;
        }
        pEVar5 = sqlite3ExprListDup(in_RDX,in_RCX,iVar3);
        pDup->pEList = pEVar5;
        *(undefined1 *)((long)&pDup->pGroupBy + 7) = 2;
        if (db_00->mallocFailed == '\0') {
          local_18 = (in_RDI->sLastToken).z;
          if (*local_18 != ';') {
            local_18 = local_18 + (*(ulong *)&(in_RDI->sLastToken).n & 0xffffffff);
          }
          iVar3 = (int)local_18 - (int)*in_RSI;
          while ((""[*(byte *)(*in_RSI + (long)(iVar3 + -1))] & 1) != 0) {
            iVar3 = iVar3 + -1;
          }
          sqlite3EndTable((Parse *)pName1,pName2,(Token *)pCNames,pSelect._4_4_,(Select *)p);
        }
      }
    }
  }
  else {
    sqlite3ErrorMsg(in_RDI,"parameters are not allowed in views");
  }
  sqlite3SelectDelete(in_stack_ffffffffffffff20,
                      (Select *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  if (1 < in_RDI->eParseMode) {
    sqlite3RenameExprlistUnmap((Parse *)db_00,(ExprList *)in_stack_ffffffffffffff20);
  }
  sqlite3ExprListDelete
            (in_stack_ffffffffffffff20,
             (ExprList *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CreateView(
  Parse *pParse,     /* The parsing context */
  Token *pBegin,     /* The CREATE token that begins the statement */
  Token *pName1,     /* The token that holds the name of the view */
  Token *pName2,     /* The token that holds the name of the view */
  ExprList *pCNames, /* Optional list of view column names */
  Select *pSelect,   /* A SELECT statement that will become the new view */
  int isTemp,        /* TRUE for a TEMPORARY view */
  int noErr          /* Suppress error messages if VIEW already exists */
){
  Table *p;
  int n;
  const char *z;
  Token sEnd;
  DbFixer sFix;
  Token *pName = 0;
  int iDb;
  sqlite3 *db = pParse->db;

  if( pParse->nVar>0 ){
    sqlite3ErrorMsg(pParse, "parameters are not allowed in views");
    goto create_view_fail;
  }
  sqlite3StartTable(pParse, pName1, pName2, isTemp, 1, 0, noErr);
  p = pParse->pNewTable;
  if( p==0 || pParse->nErr ) goto create_view_fail;

  /* Legacy versions of SQLite allowed the use of the magic "rowid" column
  ** on a view, even though views do not have rowids.  The following flag
  ** setting fixes this problem.  But the fix can be disabled by compiling
  ** with -DSQLITE_ALLOW_ROWID_IN_VIEW in case there are legacy apps that
  ** depend upon the old buggy behavior.  The ability can also be toggled
  ** using sqlite3_config(SQLITE_CONFIG_ROWID_IN_VIEW,...) */
#ifdef SQLITE_ALLOW_ROWID_IN_VIEW
  p->tabFlags |= sqlite3Config.mNoVisibleRowid; /* Optional. Allow by default */
#else
  p->tabFlags |= TF_NoVisibleRowid;             /* Never allow rowid in view */
#endif

  sqlite3TwoPartName(pParse, pName1, pName2, &pName);
  iDb = sqlite3SchemaToIndex(db, p->pSchema);
  sqlite3FixInit(&sFix, pParse, iDb, "view", pName);
  if( sqlite3FixSelect(&sFix, pSelect) ) goto create_view_fail;

  /* Make a copy of the entire SELECT statement that defines the view.
  ** This will force all the Expr.token.z values to be dynamically
  ** allocated rather than point to the input string - which means that
  ** they will persist after the current sqlite3_exec() call returns.
  */
  pSelect->selFlags |= SF_View;
  if( IN_RENAME_OBJECT ){
    p->u.view.pSelect = pSelect;
    pSelect = 0;
  }else{
    p->u.view.pSelect = sqlite3SelectDup(db, pSelect, EXPRDUP_REDUCE);
  }
  p->pCheck = sqlite3ExprListDup(db, pCNames, EXPRDUP_REDUCE);
  p->eTabType = TABTYP_VIEW;
  if( db->mallocFailed ) goto create_view_fail;

  /* Locate the end of the CREATE VIEW statement.  Make sEnd point to
  ** the end.
  */
  sEnd = pParse->sLastToken;
  assert( sEnd.z[0]!=0 || sEnd.n==0 );
  if( sEnd.z[0]!=';' ){
    sEnd.z += sEnd.n;
  }
  sEnd.n = 0;
  n = (int)(sEnd.z - pBegin->z);
  assert( n>0 );
  z = pBegin->z;
  while( sqlite3Isspace(z[n-1]) ){ n--; }
  sEnd.z = &z[n-1];
  sEnd.n = 1;

  /* Use sqlite3EndTable() to add the view to the schema table */
  sqlite3EndTable(pParse, 0, &sEnd, 0, 0);

create_view_fail:
  sqlite3SelectDelete(db, pSelect);
  if( IN_RENAME_OBJECT ){
    sqlite3RenameExprlistUnmap(pParse, pCNames);
  }
  sqlite3ExprListDelete(db, pCNames);
  return;
}